

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json_encode_test.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  _Bool _Var2;
  byte bVar3;
  
  cVar1 = '\0';
  if (1 < argc) {
    cVar1 = *argv[1];
  }
  if (cVar1 == 'u') {
LAB_001015bb:
    _Var2 = uo_json_encode_utf8_test();
  }
  else {
    if (cVar1 != 'n') {
      bVar3 = 1;
      _Var2 = uo_json_encode_number_test();
      if (!_Var2) goto LAB_001015c5;
      goto LAB_001015bb;
    }
    _Var2 = uo_json_encode_number_test();
  }
  bVar3 = _Var2 ^ 1;
LAB_001015c5:
  return (int)bVar3;
}

Assistant:

int main(
    int argc, 
    char const **argv)
{
    char test = argc > 1
        ? argv[1][0]
        : '\0';

    switch (test)
    {
        case 'n': return uo_json_encode_number_test() ? 0 : 1;
        case 'u': return uo_json_encode_utf8_test() ? 0 : 1;
        default: return uo_json_encode_number_test()
            && uo_json_encode_utf8_test() ? 0 : 1;
    }
}